

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
::internal_emplace<std::pair<int,int>const&>
          (btree<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
           *this,iterator iter,pair<int,_int> *args)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  field_type fVar5;
  slot_type *psVar6;
  slot_type *psVar7;
  template_ElementType<1UL> *ptVar8;
  undefined7 extraout_var;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar9;
  pair<int,_int> *args_00;
  allocator_type *alloc;
  allocator_type *extraout_RDX;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar10;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar11;
  ulong uVar12;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *i;
  size_type i_00;
  ulong i_01;
  iterator iVar13;
  iterator iter_local;
  allocator_type local_38;
  
  pbVar11 = iter.node;
  iter_local.position = iter.position;
  args_00 = args;
  iter_local.node = pbVar11;
  bVar2 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::leaf(pbVar11);
  if (!bVar2) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
    ::operator--(&iter_local);
    iter_local.position = iter_local.position + 1;
    pbVar11 = iter_local.node;
  }
  bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::max_count(pbVar11);
  bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::count(iter_local.node);
  if (bVar4 == bVar3) {
    if (bVar3 < 0x1e) {
      if (iter_local.node !=
          *(btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            **)this) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>, Args = <const std::pair<int, int> &>]"
                     );
      }
      args_00 = (pair<int,_int> *)0x1e;
      if ((byte)(bVar3 * '\x02') < 0x1e) {
        args_00 = (pair<int,_int> *)(ulong)(byte)(bVar3 * '\x02');
      }
      iter_local.node =
           btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
           ::new_leaf_root_node
                     ((btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(int)args_00);
      btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
      ::swap(iter_local.node,
             *(btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
               **)this,alloc);
      btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
      ::delete_leaf_node((btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                          *)this,*(node_type **)this);
      *(btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
        **)this = iter_local.node;
      *(btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
        **)(this + 0x10) = iter_local.node;
    }
    else {
      btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
      ::rebalance_or_split
                ((btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  *)this,&iter_local);
    }
  }
  pbVar11 = iter_local.node;
  uVar12 = (ulong)iter_local.position;
  bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::count(iter_local.node);
  if (uVar12 <= bVar3) {
    bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::count(pbVar11);
    if (uVar12 < bVar3) {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar11);
      bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar11);
      local_38.super_CountingAllocator<std::pair<int,_int>_>.bytes_used_ =
           (CountingAllocator<std::pair<int,_int>_>)
           btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
           ::slot(pbVar11,(ulong)bVar4 - 1);
      btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
      ::value_init<std::pair<int,int>*>
                ((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                  *)pbVar11,(ulong)bVar3,&local_38,(pair<int,_int> **)args_00);
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar11);
      alloc_00 = extraout_RDX;
      for (i_00 = (ulong)bVar3 - 2; uVar12 < i_00 + 1; i_00 = i_00 - 1) {
        psVar6 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                 ::slot(pbVar11,i_00);
        psVar7 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                 ::slot(pbVar11,i_00 + 1);
        psVar7->first = psVar6->first;
        psVar7->second = psVar6->second;
        alloc_00 = extraout_RDX_00;
      }
      btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
      ::value_destroy(pbVar11,uVar12,alloc_00);
    }
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
    ::slot(pbVar11,uVar12);
    psVar6 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
             ::slot(pbVar11,uVar12);
    iVar1 = args->second;
    psVar6->first = args->first;
    psVar6->second = iVar1;
    fVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::count(pbVar11);
    ptVar8 = btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                              *)pbVar11);
    ptVar8[2] = fVar5 + '\x01';
    bVar2 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::leaf(pbVar11);
    pbVar9 = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              *)CONCAT71(extraout_var,bVar2);
    uVar10 = extraout_RDX_01;
    if (!bVar2) {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar11);
      pbVar9 = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                *)(ulong)bVar3;
      i = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
           *)(uVar12 + 1);
      uVar10 = extraout_RDX_02;
      if (i < pbVar9) {
        bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::count(pbVar11);
        uVar12 = (ulong)bVar3;
        while ((int)i < (int)uVar12) {
          i_01 = (ulong)((int)uVar12 - 1);
          pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                   ::child(pbVar11,i_01);
          btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::set_child(pbVar11,uVar12,pbVar9);
          uVar12 = i_01;
        }
        pbVar9 = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  *)btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::mutable_child(pbVar11,(size_type)i);
        uVar10 = extraout_RDX_03;
      }
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    iVar13._8_8_ = uVar10;
    iVar13.node = pbVar9;
    return iVar13;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>, Args = <const std::pair<int, int> &>]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }